

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O0

UNewTrie2 * cloneBuilder(UNewTrie2 *other)

{
  uint32_t *puVar1;
  UNewTrie2 *trie;
  UNewTrie2 *other_local;
  
  other_local = (UNewTrie2 *)uprv_malloc_63(0x453c0);
  if (other_local == (UNewTrie2 *)0x0) {
    other_local = (UNewTrie2 *)0x0;
  }
  else {
    puVar1 = (uint32_t *)uprv_malloc_63((long)(other->dataCapacity << 2));
    other_local->data = puVar1;
    if (other_local->data == (uint32_t *)0x0) {
      uprv_free_63(other_local);
      other_local = (UNewTrie2 *)0x0;
    }
    else {
      other_local->dataCapacity = other->dataCapacity;
      memcpy(other_local,other,0x880);
      memcpy(other_local->index2,other->index2,(long)other->index2Length << 2);
      other_local->index2NullOffset = other->index2NullOffset;
      other_local->index2Length = other->index2Length;
      memcpy(other_local->data,other->data,(long)other->dataLength << 2);
      other_local->dataNullOffset = other->dataNullOffset;
      other_local->dataLength = other->dataLength;
      if (other->isCompacted == '\0') {
        memcpy(other_local->map,other->map,((ulong)(long)other->dataLength >> 5) << 2);
        other_local->firstFreeBlock = other->firstFreeBlock;
      }
      else {
        other_local->firstFreeBlock = 0;
      }
      other_local->initialValue = other->initialValue;
      other_local->errorValue = other->errorValue;
      other_local->highStart = other->highStart;
      other_local->isCompacted = other->isCompacted;
    }
  }
  return other_local;
}

Assistant:

static UNewTrie2 *
cloneBuilder(const UNewTrie2 *other) {
    UNewTrie2 *trie;

    trie=(UNewTrie2 *)uprv_malloc(sizeof(UNewTrie2));
    if(trie==NULL) {
        return NULL;
    }

    trie->data=(uint32_t *)uprv_malloc(other->dataCapacity*4);
    if(trie->data==NULL) {
        uprv_free(trie);
        return NULL;
    }
#ifdef UCPTRIE_DEBUG
    if(other->t3==nullptr) {
        trie->t3=nullptr;
    } else {
        UErrorCode errorCode=U_ZERO_ERROR;
        trie->t3=umutablecptrie_clone(other->t3, &errorCode);
    }
#endif
    trie->dataCapacity=other->dataCapacity;

    /* clone data */
    uprv_memcpy(trie->index1, other->index1, sizeof(trie->index1));
    uprv_memcpy(trie->index2, other->index2, (size_t)other->index2Length*4);
    trie->index2NullOffset=other->index2NullOffset;
    trie->index2Length=other->index2Length;

    uprv_memcpy(trie->data, other->data, (size_t)other->dataLength*4);
    trie->dataNullOffset=other->dataNullOffset;
    trie->dataLength=other->dataLength;

    /* reference counters */
    if(other->isCompacted) {
        trie->firstFreeBlock=0;
    } else {
        uprv_memcpy(trie->map, other->map, ((size_t)other->dataLength>>UTRIE2_SHIFT_2)*4);
        trie->firstFreeBlock=other->firstFreeBlock;
    }

    trie->initialValue=other->initialValue;
    trie->errorValue=other->errorValue;
    trie->highStart=other->highStart;
    trie->isCompacted=other->isCompacted;

    return trie;
}